

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O1

size_t ZSTD_CCtxParams_init_advanced(ZSTD_CCtx_params *cctxParams,ZSTD_parameters params)

{
  undefined8 uVar1;
  undefined8 uVar2;
  size_t sVar3;
  
  if (cctxParams != (ZSTD_CCtx_params *)0x0) {
    sVar3 = ZSTD_checkCParams(params.cParams);
    if (sVar3 < 0xffffffffffffff89) {
      (cctxParams->customMem).customFree = (ZSTD_freeFunction)0x0;
      (cctxParams->customMem).opaque = (void *)0x0;
      (cctxParams->ldmParams).hashRateLog = 0;
      (cctxParams->ldmParams).windowLog = 0;
      (cctxParams->customMem).customAlloc = (ZSTD_allocFunction)0x0;
      (cctxParams->ldmParams).enableLdm = 0;
      (cctxParams->ldmParams).hashLog = 0;
      (cctxParams->ldmParams).bucketSizeLog = 0;
      (cctxParams->ldmParams).minMatchLength = 0;
      cctxParams->jobSize = 0;
      cctxParams->overlapLog = 0;
      cctxParams->rsyncable = 0;
      cctxParams->forceWindow = 0;
      cctxParams->attachDictPref = ZSTD_dictDefaultAttach;
      *(undefined8 *)&cctxParams->nbWorkers = 0;
      (cctxParams->fParams).contentSizeFlag = 0;
      (cctxParams->fParams).checksumFlag = 0;
      *(undefined8 *)&(cctxParams->fParams).noDictIDFlag = 0;
      (cctxParams->cParams).searchLog = 0;
      (cctxParams->cParams).minMatch = 0;
      (cctxParams->cParams).targetLength = 0;
      (cctxParams->cParams).strategy = 0;
      cctxParams->format = ZSTD_f_zstd1;
      (cctxParams->cParams).windowLog = 0;
      (cctxParams->cParams).chainLog = 0;
      (cctxParams->cParams).hashLog = 0;
      uVar1 = params.cParams._8_8_;
      uVar2 = params.cParams._12_8_;
      (cctxParams->cParams).windowLog = params.cParams.windowLog;
      (cctxParams->cParams).chainLog = params.cParams.chainLog;
      (cctxParams->cParams).hashLog = (int)uVar1;
      (cctxParams->cParams).searchLog = (int)((ulong)uVar1 >> 0x20);
      (cctxParams->cParams).searchLog = (int)uVar2;
      (cctxParams->cParams).minMatch = (int)((ulong)uVar2 >> 0x20);
      (cctxParams->cParams).targetLength = params.cParams.targetLength;
      (cctxParams->cParams).strategy = params.cParams.strategy;
      (cctxParams->fParams).contentSizeFlag = params.fParams.contentSizeFlag;
      (cctxParams->fParams).checksumFlag = params.fParams.checksumFlag;
      (cctxParams->fParams).noDictIDFlag = params.fParams.noDictIDFlag;
      cctxParams->compressionLevel = 3;
      sVar3 = 0;
    }
    return sVar3;
  }
  return 0xffffffffffffffff;
}

Assistant:

size_t ZSTD_CCtxParams_init_advanced(ZSTD_CCtx_params* cctxParams, ZSTD_parameters params)
{
    if (!cctxParams) { return ERROR(GENERIC); }
    CHECK_F( ZSTD_checkCParams(params.cParams) );
    memset(cctxParams, 0, sizeof(*cctxParams));
    cctxParams->cParams = params.cParams;
    cctxParams->fParams = params.fParams;
    cctxParams->compressionLevel = ZSTD_CLEVEL_DEFAULT;   /* should not matter, as all cParams are presumed properly defined */
    assert(!ZSTD_checkCParams(params.cParams));
    return 0;
}